

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O2

Eci * libsgp4::SGP4::CalculateFinalPositionVelocity
                (Eci *__return_storage_ptr__,DateTime *dt,double e,double a,double omega,double xl,
                double xnode,double xinc,double xlcof,double aycof,double x3thm1,double x1mth2,
                double x7thm1,double cosio,double sinio)

{
  bool bVar1;
  DecayedException *this;
  int i;
  uint uVar2;
  pointer_____offset_0x10___ *ppuVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 local_58 [16];
  double local_48;
  double local_40;
  Vector local_38;
  
  dVar10 = kXKE;
  dVar4 = pow(a,1.5);
  dVar5 = cos(omega);
  dVar5 = dVar5 * e;
  dVar12 = 1.0 / ((1.0 - e * e) * a);
  dVar6 = sin(omega);
  dVar6 = dVar6 * e + aycof * dVar12;
  dVar15 = dVar5 * dVar5 + dVar6 * dVar6;
  if (1.0 <= dVar15) {
    this = (DecayedException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException((SatelliteException *)this,"Error: (elsq >= 1.0)");
  }
  else {
    dVar7 = fmod((dVar12 * xlcof * dVar5 + xl) - xnode,6.283185307179586);
    dVar13 = ABS(SQRT(dVar15)) * 1.25;
    dVar8 = 0.0;
    dVar11 = 0.0;
    dVar20 = 0.0;
    bVar1 = true;
    uVar2 = 0;
    dVar18 = 0.0;
    dVar12 = dVar7;
    while ((dVar14 = kXKE, uVar2 < 10 && (bVar1))) {
      dVar11 = sin(dVar12);
      dVar8 = cos(dVar12);
      dVar18 = dVar5 * dVar8 + dVar6 * dVar11;
      dVar20 = dVar5 * dVar11 + dVar8 * -dVar6;
      dVar14 = (dVar7 - dVar12) + dVar20;
      bVar1 = 1e-12 <= ABS(dVar14);
      if (1e-12 <= ABS(dVar14)) {
        dVar16 = dVar14 / (1.0 - dVar18);
        if (uVar2 == 0) {
          dVar14 = dVar13;
          if ((dVar16 <= dVar13) && (dVar14 = dVar16, dVar16 < -dVar13)) {
            dVar14 = -dVar13;
          }
        }
        else {
          dVar14 = dVar14 / (dVar20 * 0.5 * dVar16 + (1.0 - dVar18));
        }
        dVar12 = dVar12 + dVar14;
      }
      uVar2 = uVar2 + 1;
    }
    dVar15 = 1.0 - dVar15;
    dVar12 = dVar15 * a;
    if (0.0 <= dVar12) {
      dVar7 = (1.0 - dVar18) * a;
      if (a < 0.0) {
        dVar13 = sqrt(a);
      }
      else {
        dVar13 = SQRT(a);
      }
      dVar18 = kXKE;
      dVar16 = 1.0 / dVar7;
      if (dVar12 < 0.0) {
        dVar9 = sqrt(dVar12);
      }
      else {
        dVar9 = SQRT(dVar12);
      }
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      dVar19 = 1.0 / (dVar15 + 1.0);
      dVar8 = a * dVar16 * (dVar19 * dVar20 * dVar6 + (dVar8 - dVar5));
      dVar6 = a * dVar16 * (dVar19 * dVar20 * -dVar5 + (dVar11 - dVar6));
      dVar5 = atan2(dVar6,dVar8);
      dVar22 = (dVar6 + dVar6) * dVar8;
      dVar11 = (1.0 / dVar12) * 0.000541308;
      dVar6 = (1.0 / dVar12) * dVar11;
      dVar21 = dVar6 * 1.5;
      dVar8 = (dVar8 + dVar8) * dVar8 + -1.0;
      dVar19 = dVar7 * (1.0 - dVar15 * dVar21 * x3thm1) + dVar11 * 0.5 * x1mth2 * dVar8;
      dVar5 = dVar5 + dVar6 * -0.25 * x7thm1 * dVar22;
      dVar21 = dVar21 * cosio;
      dVar12 = dVar21 * dVar22 + xnode;
      dVar6 = dVar21 * sinio * dVar8 + xinc;
      dVar11 = (dVar10 / dVar4) * dVar11;
      dVar7 = dVar14 * dVar13 * dVar20 * dVar16 - dVar11 * x1mth2 * dVar22;
      dVar8 = (dVar8 * x1mth2 + x3thm1 * 1.5) * dVar11 + dVar18 * dVar9 * dVar16;
      dVar10 = sin(dVar5);
      dVar4 = cos(dVar5);
      dVar5 = sin(dVar6);
      dVar6 = cos(dVar6);
      dVar15 = sin(dVar12);
      dVar12 = cos(dVar12);
      local_38.z = dVar10 * dVar5 * dVar19 * 6378.135;
      local_38.w = 0.0;
      local_48 = ((dVar5 * dVar4 * dVar8 + dVar7 * dVar10 * dVar5) * 6378.135) / 60.0;
      dVar5 = dVar10 * -dVar15 * dVar6 + dVar12 * dVar4;
      dVar11 = dVar10 * dVar12 * dVar6 + dVar15 * dVar4;
      auVar17._0_8_ =
           (dVar7 * dVar5 + dVar8 * (-dVar15 * dVar6 * dVar4 - dVar10 * dVar12)) * 6378.135;
      auVar17._8_8_ =
           (dVar7 * dVar11 + dVar8 * (dVar12 * dVar6 * dVar4 - dVar10 * dVar15)) * 6378.135;
      local_58 = divpd(auVar17,_DAT_00109dd0);
      local_40 = 0.0;
      local_38.x = dVar19 * dVar5 * 6378.135;
      local_38.y = dVar19 * dVar11 * 6378.135;
      if (1.0 <= dVar19) {
        Eci::Eci(__return_storage_ptr__,dt,&local_38,(Vector *)local_58);
        return __return_storage_ptr__;
      }
      this = (DecayedException *)__cxa_allocate_exception(0x58);
      DecayedException::DecayedException(this,dt,&local_38,(Vector *)local_58);
      ppuVar3 = &DecayedException::typeinfo;
      goto LAB_00107a73;
    }
    this = (DecayedException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException((SatelliteException *)this,"Error: (pl < 0.0)");
  }
  ppuVar3 = &SatelliteException::typeinfo;
LAB_00107a73:
  __cxa_throw(this,ppuVar3,std::runtime_error::~runtime_error);
}

Assistant:

Eci SGP4::CalculateFinalPositionVelocity(
        const DateTime& dt,
        const double e,
        const double a,
        const double omega,
        const double xl,
        const double xnode,
        const double xinc,
        const double xlcof,
        const double aycof,
        const double x3thm1,
        const double x1mth2,
        const double x7thm1,
        const double cosio,
        const double sinio)
{
    const double beta2 = 1.0 - e * e;
    const double xn = kXKE / pow(a, 1.5);
    /*
     * long period periodics
     */
    const double axn = e * cos(omega);
    const double temp11 = 1.0 / (a * beta2);
    const double xll = temp11 * xlcof * axn;
    const double aynl = temp11 * aycof;
    const double xlt = xl + xll;
    const double ayn = e * sin(omega) + aynl;
    const double elsq = axn * axn + ayn * ayn;

    if (elsq >= 1.0)
    {
        throw SatelliteException("Error: (elsq >= 1.0)");
    }

    /*
     * solve keplers equation
     * - solve using Newton-Raphson root solving
     * - here capu is almost the mean anomoly
     * - initialise the eccentric anomaly term epw
     * - The fmod saves reduction of angle to +/-2pi in sin/cos() and prevents
     * convergence problems.
     */
    const double capu = fmod(xlt - xnode, kTWOPI);
    double epw = capu;

    double sinepw = 0.0;
    double cosepw = 0.0;
    double ecose = 0.0;
    double esine = 0.0;

    /*
     * sensibility check for N-R correction
     */
    const double max_newton_naphson = 1.25 * fabs(sqrt(elsq));

    bool kepler_running = true;

    for (int i = 0; i < 10 && kepler_running; i++)
    {
        sinepw = sin(epw);
        cosepw = cos(epw);
        ecose = axn * cosepw + ayn * sinepw;
        esine = axn * sinepw - ayn * cosepw;

        double f = capu - epw + esine;

        if (fabs(f) < 1.0e-12)
        {
            kepler_running = false;
        }
        else
        {
            /*
             * 1st order Newton-Raphson correction
             */
            const double fdot = 1.0 - ecose;
            double delta_epw = f / fdot;

            /*
             * 2nd order Newton-Raphson correction.
             * f / (fdot - 0.5 * d2f * f/fdot)
             */
            if (i == 0)
            {
                if (delta_epw > max_newton_naphson)
                {
                    delta_epw = max_newton_naphson;
                }
                else if (delta_epw < -max_newton_naphson)
                {
                    delta_epw = -max_newton_naphson;
                }
            }
            else
            {
                delta_epw = f / (fdot + 0.5 * esine * delta_epw);
            }

            /*
             * Newton-Raphson correction of -F/DF
             */
            epw += delta_epw;
        }
    }
    /*
     * short period preliminary quantities
     */
    const double temp21 = 1.0 - elsq;
    const double pl = a * temp21;

    if (pl < 0.0)
    {
        throw SatelliteException("Error: (pl < 0.0)");
    }

    const double r = a * (1.0 - ecose);
    const double temp31 = 1.0 / r;
    const double rdot = kXKE * sqrt(a) * esine * temp31;
    const double rfdot = kXKE * sqrt(pl) * temp31;
    const double temp32 = a * temp31;
    const double betal = sqrt(temp21);
    const double temp33 = 1.0 / (1.0 + betal);
    const double cosu = temp32 * (cosepw - axn + ayn * esine * temp33);
    const double sinu = temp32 * (sinepw - ayn - axn * esine * temp33);
    const double u = atan2(sinu, cosu);
    const double sin2u = 2.0 * sinu * cosu;
    const double cos2u = 2.0 * cosu * cosu - 1.0;

    /*
     * update for short periodics
     */
    const double temp41 = 1.0 / pl;
    const double temp42 = kCK2 * temp41;
    const double temp43 = temp42 * temp41;

    const double rk = r * (1.0 - 1.5 * temp43 * betal * x3thm1)
        + 0.5 * temp42 * x1mth2 * cos2u;
    const double uk = u - 0.25 * temp43 * x7thm1 * sin2u;
    const double xnodek = xnode + 1.5 * temp43 * cosio * sin2u;
    const double xinck = xinc + 1.5 * temp43 * cosio * sinio * cos2u;
    const double rdotk = rdot - xn * temp42 * x1mth2 * sin2u;
    const double rfdotk = rfdot + xn * temp42 * (x1mth2 * cos2u + 1.5 * x3thm1);

    /*
     * orientation vectors
     */
    const double sinuk = sin(uk);
    const double cosuk = cos(uk);
    const double sinik = sin(xinck);
    const double cosik = cos(xinck);
    const double sinnok = sin(xnodek);
    const double cosnok = cos(xnodek);
    const double xmx = -sinnok * cosik;
    const double xmy = cosnok * cosik;
    const double ux = xmx * sinuk + cosnok * cosuk;
    const double uy = xmy * sinuk + sinnok * cosuk;
    const double uz = sinik * sinuk;
    const double vx = xmx * cosuk - cosnok * sinuk;
    const double vy = xmy * cosuk - sinnok * sinuk;
    const double vz = sinik * cosuk;
    /*
     * position and velocity
     */
    const double x = rk * ux * kXKMPER;
    const double y = rk * uy * kXKMPER;
    const double z = rk * uz * kXKMPER;
    Vector position(x, y, z);
    const double xdot = (rdotk * ux + rfdotk * vx) * kXKMPER / 60.0;
    const double ydot = (rdotk * uy + rfdotk * vy) * kXKMPER / 60.0;
    const double zdot = (rdotk * uz + rfdotk * vz) * kXKMPER / 60.0;
    Vector velocity(xdot, ydot, zdot);

    if (rk < 1.0)
    {
        throw DecayedException(
                dt,
                position,
                velocity);
    }

    return Eci(dt, position, velocity);
}